

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::
BasicResult<Catch::clara::detail::ParseResultType>
          (BasicResult<Catch::clara::detail::ParseState> *this,
          BasicResult<Catch::clara::detail::ParseResultType> *other)

{
  pointer pcVar1;
  
  (this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase.m_type =
       (other->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.m_type
  ;
  (this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase._vptr_ResultBase
       = (_func_int **)&PTR__BasicResult_00241928;
  (this->m_errorMessage)._M_dataplus._M_p = (pointer)&(this->m_errorMessage).field_2;
  pcVar1 = (other->m_errorMessage)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_errorMessage,pcVar1,
             pcVar1 + (other->m_errorMessage)._M_string_length);
  if ((this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase.m_type != Ok)
  {
    return;
  }
  __assert_fail("type() != ResultBase::Ok",
                "/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/build_O1/_deps/catch2-src/single_include/catch2/catch.hpp"
                ,0x2326,
                "Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::BasicResult(const BasicResult<U> &) [T = Catch::clara::detail::ParseState, U = Catch::clara::detail::ParseResultType]"
               );
}

Assistant:

explicit BasicResult( BasicResult<U> const &other )
        :   ResultValueBase<T>( other.type() ),
            m_errorMessage( other.errorMessage() )
        {
            assert( type() != ResultBase::Ok );
        }